

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_set_column.h
# Opt level: O2

bool Gudhi::persistence_matrix::operator==
               (Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>
                *c1,Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>
                    *c2)

{
  bool bVar1;
  
  if (c1 != c2) {
    bVar1 = boost::intrusive::operator==
                      ((bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
                        *)&c1->column_,
                       (bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
                        *)&c2->column_);
    return bVar1;
  }
  return true;
}

Assistant:

bool operator==(const Intrusive_set_column& c1, const Intrusive_set_column& c2) {
    if (&c1 == &c2) return true;

    if constexpr (Master_matrix::Option_list::is_z2) {
      return c1.column_ == c2.column_;
    } else {
      auto it1 = c1.column_.begin();
      auto it2 = c2.column_.begin();
      if (c1.column_.size() != c2.column_.size()) return false;
      while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
        if (it1->get_row_index() != it2->get_row_index() || it1->get_element() != it2->get_element()) return false;
        ++it1;
        ++it2;
      }
      return true;
    }
  }